

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O0

VertexWeightTable * Assimp::ComputeVertexBoneWeightTable(aiMesh *pMesh)

{
  uint uVar1;
  undefined1 auVar2 [16];
  aiColor4D **ppaVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong uVar7;
  aiMesh *local_60;
  pair<unsigned_int,_float> local_48;
  uint *local_40;
  aiVertexWeight *weight;
  pair<unsigned_int,_float> pStack_30;
  uint a;
  aiBone *bone;
  aiMesh *paStack_20;
  uint i;
  VertexWeightTable *avPerVertexWeights;
  aiMesh *pMesh_local;
  
  if (((pMesh == (aiMesh *)0x0) || (pMesh->mNumVertices == 0)) || (pMesh->mNumBones == 0)) {
    pMesh_local = (aiMesh *)0x0;
  }
  else {
    uVar4 = CONCAT44(0,pMesh->mNumVertices);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar4;
    uVar5 = SUB168(auVar2 * ZEXT816(0x18),0);
    uVar7 = uVar5 + 8;
    if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar5) {
      uVar7 = 0xffffffffffffffff;
    }
    avPerVertexWeights = (VertexWeightTable *)pMesh;
    puVar6 = (ulong *)operator_new__(uVar7);
    *puVar6 = uVar4;
    paStack_20 = (aiMesh *)(puVar6 + 1);
    if (uVar4 != 0) {
      local_60 = paStack_20;
      do {
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                *)local_60);
        local_60 = (aiMesh *)&local_60->mNormals;
      } while (local_60 != (aiMesh *)(paStack_20->mColors + uVar4 * 3 + -6));
    }
    for (bone._4_4_ = 0;
        bone._4_4_ <
        *(uint *)&avPerVertexWeights[9].
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; bone._4_4_ = bone._4_4_ + 1) {
      pStack_30 = avPerVertexWeights[9].
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[bone._4_4_];
      for (weight._4_4_ = 0; weight._4_4_ < *(uint *)((long)pStack_30 + 0x404);
          weight._4_4_ = weight._4_4_ + 1) {
        local_40 = (uint *)(*(long *)((long)pStack_30 + 0x408) + (ulong)weight._4_4_ * 8);
        uVar1 = *local_40;
        ppaVar3 = paStack_20->mColors;
        std::pair<unsigned_int,_float>::pair<unsigned_int_&,_true>
                  (&local_48,(uint *)((long)&bone + 4),(float *)(local_40 + 1));
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        push_back((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   *)(ppaVar3 + (ulong)uVar1 * 3 + -6),&local_48);
      }
    }
    pMesh_local = paStack_20;
  }
  return (VertexWeightTable *)pMesh_local;
}

Assistant:

VertexWeightTable* ComputeVertexBoneWeightTable(const aiMesh* pMesh)
{
    if (!pMesh || !pMesh->mNumVertices || !pMesh->mNumBones) {
        return NULL;
    }

    VertexWeightTable* avPerVertexWeights = new VertexWeightTable[pMesh->mNumVertices];
    for (unsigned int i = 0; i < pMesh->mNumBones;++i)  {

        aiBone* bone = pMesh->mBones[i];
        for (unsigned int a = 0; a < bone->mNumWeights;++a) {
            const aiVertexWeight& weight = bone->mWeights[a];
            avPerVertexWeights[weight.mVertexId].push_back( std::pair<unsigned int,float>(i,weight.mWeight) );
        }
    }
    return avPerVertexWeights;
}